

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_mac_update(psa_mac_operation_t *operation,uint8_t *input,size_t input_length)

{
  int ret_00;
  int local_2c;
  int ret;
  psa_status_t status;
  size_t input_length_local;
  uint8_t *input_local;
  psa_mac_operation_t *operation_local;
  
  if ((operation->field_0x4 & 1) == 0) {
    operation_local._4_4_ = -0x89;
  }
  else if ((((byte)operation->field_0x4 >> 1 & 1) == 0) ||
          (((byte)operation->field_0x4 >> 2 & 1) != 0)) {
    operation->field_0x4 = operation->field_0x4 & 0xf7 | 8;
    if (operation->alg == 0x2c00002) {
      ret_00 = mbedtls_cipher_cmac_update(&(operation->ctx).cmac,input,input_length);
      local_2c = mbedtls_to_psa_error(ret_00);
    }
    else {
      if ((operation->alg & 0x7fc00000) != 0x2800000) {
        return -0x89;
      }
      local_2c = psa_hash_update(&(operation->ctx).hmac.hash_ctx,input,input_length);
    }
    if (local_2c != 0) {
      psa_mac_abort(operation);
    }
    operation_local._4_4_ = local_2c;
  }
  else {
    operation_local._4_4_ = -0x89;
  }
  return operation_local._4_4_;
}

Assistant:

psa_status_t psa_mac_update( psa_mac_operation_t *operation,
                             const uint8_t *input,
                             size_t input_length )
{
    psa_status_t status = PSA_ERROR_BAD_STATE;
    if( ! operation->key_set )
        return( PSA_ERROR_BAD_STATE );
    if( operation->iv_required && ! operation->iv_set )
        return( PSA_ERROR_BAD_STATE );
    operation->has_input = 1;

#if defined(MBEDTLS_CMAC_C)
    if( operation->alg == PSA_ALG_CMAC )
    {
        int ret = mbedtls_cipher_cmac_update( &operation->ctx.cmac,
                                              input, input_length );
        status = mbedtls_to_psa_error( ret );
    }
    else
#endif /* MBEDTLS_CMAC_C */
#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HMAC( operation->alg ) )
    {
        status = psa_hash_update( &operation->ctx.hmac.hash_ctx, input,
                                  input_length );
    }
    else
#endif /* MBEDTLS_MD_C */
    {
        /* This shouldn't happen if `operation` was initialized by
         * a setup function. */
        return( PSA_ERROR_BAD_STATE );
    }

    if( status != PSA_SUCCESS )
        psa_mac_abort( operation );
    return( status );
}